

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O2

void __thiscall libtorrent::aux::merkle_tree::optimize_storage(merkle_tree *this)

{
  pointer pdVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  __first;
  vector<sha256_hash> new_tree;
  allocator_type local_41;
  vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> local_40 [24];
  
  if (this->m_mode == full_tree) {
    if (this->m_num_blocks == 1) {
      pdVar1 = (this->m_tree).
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_tree).
          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pdVar1) {
        (this->m_tree).
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pdVar1;
      }
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
      _M_shrink_to_fit(&(this->m_tree).
                        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      );
      this->m_mode = empty_tree;
      bitfield::clear(&this->m_block_verified);
      return;
    }
    iVar3 = block_layer_start(this);
    bVar2 = bitfield::all_set(&this->m_block_verified);
    if (bVar2) {
      __first._M_current =
           (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar3;
      ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
      vector<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
                (local_40,__first,__first._M_current + this->m_num_blocks,&local_41);
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
      _M_move_assign(&(this->m_tree).
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ,local_40);
      this->m_mode = block_layer;
      bitfield::clear(&this->m_block_verified);
      ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
      ::~_Vector_base((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       *)local_40);
    }
  }
  return;
}

Assistant:

void merkle_tree::optimize_storage()
	{
		INVARIANT_CHECK;
		if (m_mode != mode_t::full_tree) return;

		if (m_num_blocks == 1)
		{
			// if this tree *just* has a root, no need to use any storage for
			// nodes
			m_tree.clear();
			m_tree.shrink_to_fit();
			m_mode = mode_t::empty_tree;
			m_block_verified.clear();
			return;
		}

		int const start = block_layer_start();
		if (m_block_verified.all_set())
		{
			aux::vector<sha256_hash> new_tree(m_tree.begin() + start, m_tree.begin() + start + m_num_blocks);

			m_tree = std::move(new_tree);
			m_mode = mode_t::block_layer;
			m_block_verified.clear();
			return;
		}
	}